

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA1.cpp
# Opt level: O1

void __thiscall CSHA1::ReportHash(CSHA1 *this,char *szReport,uchar uReportType)

{
  long lVar1;
  char szTemp [16];
  char acStack_38 [16];
  
  if (szReport != (char *)0x0) {
    if (uReportType == '\x01') {
      sprintf(acStack_38,"%u",(ulong)this->m_digest[0]);
      strcat(szReport,acStack_38);
      lVar1 = 0;
      do {
        sprintf(acStack_38," %u",(ulong)this->m_digest[lVar1 + 1]);
        strcat(szReport,acStack_38);
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x13);
    }
    else if (uReportType == '\0') {
      sprintf(acStack_38,"%02X",(ulong)this->m_digest[0]);
      strcat(szReport,acStack_38);
      lVar1 = 0;
      do {
        sprintf(acStack_38," %02X",(ulong)this->m_digest[lVar1 + 1]);
        strcat(szReport,acStack_38);
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x13);
    }
    else {
      builtin_strncpy(szReport,"Error: Unknown report type!",0x1c);
    }
  }
  return;
}

Assistant:

void CSHA1::ReportHash(char *szReport, unsigned char uReportType)
{
	unsigned char i;
	char szTemp[16];

	if(szReport == NULL) return;

	if(uReportType == REPORT_HEX)
	{
		sprintf(szTemp, "%02X", m_digest[0]);
		strcat(szReport, szTemp);

		for(i = 1; i < 20; i++)
		{
			sprintf(szTemp, " %02X", m_digest[i]);
			strcat(szReport, szTemp);
		}
	}
	else if(uReportType == REPORT_DIGIT)
	{
		sprintf(szTemp, "%u", m_digest[0]);
		strcat(szReport, szTemp);

		for(i = 1; i < 20; i++)
		{
			sprintf(szTemp, " %u", m_digest[i]);
			strcat(szReport, szTemp);
		}
	}
	else strcpy(szReport, "Error: Unknown report type!");
}